

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Curl_tree *pCVar3;
  timediff_t tVar4;
  curltime cVar5;
  curltime i;
  curltime newer;
  curltime older;
  uint local_3c;
  uint local_38;
  uint local_34;
  timediff_t diff;
  curltime now;
  long *timeout_ms_local;
  Curl_multi *multi_local;
  
  if (multi->timetree == (Curl_tree *)0x0) {
    *timeout_ms = -1;
  }
  else {
    cVar5 = Curl_now();
    i.tv_usec = multi_timeout::tv_zero.tv_usec;
    i.tv_sec = multi_timeout::tv_zero.tv_sec;
    i._12_4_ = 0;
    pCVar3 = Curl_splay(i,multi->timetree);
    multi->timetree = pCVar3;
    if ((multi->timetree->key).tv_sec < cVar5.tv_sec) {
      local_34 = 0xffffffff;
    }
    else {
      if (cVar5.tv_sec < (multi->timetree->key).tv_sec) {
        local_38 = 1;
      }
      else {
        if ((multi->timetree->key).tv_usec < cVar5.tv_usec) {
          local_3c = 0xffffffff;
        }
        else {
          local_3c = (uint)(cVar5.tv_usec < (multi->timetree->key).tv_usec);
        }
        local_38 = local_3c;
      }
      local_34 = local_38;
    }
    if ((int)local_34 < 1) {
      *timeout_ms = 0;
    }
    else {
      uVar1 = (multi->timetree->key).tv_sec;
      uVar2 = (multi->timetree->key).tv_usec;
      newer.tv_usec = uVar2;
      newer.tv_sec = uVar1;
      newer._12_4_ = 0;
      older._12_4_ = 0;
      older.tv_sec = SUB128(cVar5._0_12_,0);
      older.tv_usec = SUB124(cVar5._0_12_,8);
      tVar4 = Curl_timediff(newer,older);
      if (tVar4 < 1) {
        *timeout_ms = 1;
      }
      else {
        *timeout_ms = tVar4;
      }
    }
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               long *timeout_ms)
{
  static struct curltime tv_zero = {0, 0};

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct curltime now = Curl_now();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);

    if(Curl_splaycomparekeys(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      timediff_t diff = Curl_timediff(multi->timetree->key, now);
      if(diff <= 0)
        /*
         * Since we only provide millisecond resolution on the returned value
         * and the diff might be less than one millisecond here, we don't
         * return zero as that may cause short bursts of busyloops on fast
         * processors while the diff is still present but less than one
         * millisecond! instead we return 1 until the time is ripe.
         */
        *timeout_ms = 1;
      else
        /* this should be safe even on 64 bit archs, as we don't use that
           overly long timeouts */
        *timeout_ms = (long)diff;
    }
    else
      /* 0 means immediately */
      *timeout_ms = 0;
  }
  else
    *timeout_ms = -1;

  return CURLM_OK;
}